

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpdec.c
# Opt level: O0

int ReadWebP(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  bool bVar1;
  int iVar2;
  VP8StatusCode VVar3;
  int in_ECX;
  int iVar4;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  uint32_t *argb;
  int y;
  int x;
  uint64_t stride;
  int has_alpha;
  WebPBitstreamFeatures *bitstream;
  WebPDecBuffer *output_buffer;
  WebPDecoderConfig config;
  VP8StatusCode status;
  int ok;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  uint8_t *in_stack_fffffffffffffe98;
  long local_158;
  int local_150;
  int local_14c;
  uint64_t local_148;
  Metadata *in_stack_fffffffffffffed8;
  int iVar5;
  size_t in_stack_fffffffffffffee0;
  uint8_t *in_stack_fffffffffffffee8;
  VP8StatusCode local_38;
  uint local_34;
  uint local_4;
  
  local_34 = 0;
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == (int *)0x0)) {
    local_4 = 0;
  }
  else {
    iVar2 = WebPInitDecoderConfig((WebPDecoderConfig *)0x107ec7);
    if (iVar2 == 0) {
      fprintf(stderr,"Library version mismatch!\n");
      local_4 = 0;
    }
    else {
      VVar3 = WebPGetFeatures((uint8_t *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                              (WebPBitstreamFeatures *)0x107f0e);
      if (VVar3 == VP8_STATUS_OK) {
        bVar1 = in_ECX != 0 && (int)in_stack_fffffffffffffee0 != 0;
        iVar2 = (int)in_stack_fffffffffffffed8;
        in_RDX[2] = iVar2;
        iVar5 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
        in_RDX[3] = iVar5;
        if (*in_RDX == 0) {
          iVar4 = 3;
          if (bVar1) {
            iVar4 = 5;
          }
          local_148 = (ulong)((long)iVar2 * (long)iVar4) >> 1;
          iVar2 = 0;
          if (bVar1) {
            iVar2 = 4;
          }
          in_RDX[1] = iVar2;
        }
        else {
          local_148 = (long)iVar2 << 2;
        }
        iVar2 = ImgIoUtilCheckSizeArgumentsOverflow(local_148,(long)iVar5);
        if (iVar2 == 0) {
          local_38 = VP8_STATUS_OUT_OF_MEMORY;
        }
        else {
          iVar2 = WebPPictureAlloc((WebPPicture *)
                                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          if (iVar2 == 0) {
            local_38 = VP8_STATUS_OUT_OF_MEMORY;
            local_34 = 0;
          }
          else {
            if (*in_RDX == 0) {
              if (bVar1) {
                in_stack_fffffffffffffe98 = *(uint8_t **)(in_RDX + 0xc);
                in_stack_fffffffffffffe94 = in_RDX[0xe];
              }
              else {
                in_stack_fffffffffffffe98 = (uint8_t *)0x0;
                in_stack_fffffffffffffe94 = 0;
              }
            }
            local_38 = DecodeWebP(in_stack_fffffffffffffe98,
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                  (WebPDecoderConfig *)
                                  CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            local_34 = (uint)(local_38 == VP8_STATUS_OK);
            if (((local_34 != 0) && (in_ECX == 0)) && (*in_RDX != 0)) {
              local_158 = *(long *)(in_RDX + 0x12);
              for (local_150 = 0; local_150 < in_RDX[3]; local_150 = local_150 + 1) {
                for (local_14c = 0; local_14c < in_RDX[2]; local_14c = local_14c + 1) {
                  *(uint *)(local_158 + (long)local_14c * 4) =
                       *(uint *)(local_158 + (long)local_14c * 4) | 0xff000000;
                }
                local_158 = local_158 + (long)in_RDX[0x14] * 4;
              }
            }
          }
        }
        if (local_38 != VP8_STATUS_OK) {
          PrintWebPError((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         in_stack_fffffffffffffe8c);
          local_34 = 0;
        }
        WebPFreeDecBuffer((WebPDecBuffer *)0x10838a);
        if (((local_34 != 0) && (in_R8 != 0)) &&
           (local_34 = ExtractMetadata(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                       in_stack_fffffffffffffed8), local_34 == 0)) {
          PrintWebPError((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         in_stack_fffffffffffffe8c);
        }
        if (local_34 == 0) {
          WebPPictureFree((WebPPicture *)0x1083f7);
        }
        local_4 = local_34;
      }
      else {
        PrintWebPError((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       in_stack_fffffffffffffe8c);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int ReadWebP(const uint8_t* const data, size_t data_size,
             WebPPicture* const pic,
             int keep_alpha, Metadata* const metadata) {
  int ok = 0;
  VP8StatusCode status = VP8_STATUS_OK;
  WebPDecoderConfig config;
  WebPDecBuffer* const output_buffer = &config.output;
  WebPBitstreamFeatures* const bitstream = &config.input;

  if (data == NULL || data_size == 0 || pic == NULL) return 0;

  if (!WebPInitDecoderConfig(&config)) {
    fprintf(stderr, "Library version mismatch!\n");
    return 0;
  }

  status = WebPGetFeatures(data, data_size, bitstream);
  if (status != VP8_STATUS_OK) {
    PrintWebPError("input data", status);
    return 0;
  }

  do {
    const int has_alpha = keep_alpha && bitstream->has_alpha;
    uint64_t stride;
    pic->width = bitstream->width;
    pic->height = bitstream->height;
    if (pic->use_argb) {
      stride = (uint64_t)bitstream->width * 4;
    } else {
      stride = (uint64_t)bitstream->width * (has_alpha ? 5 : 3) / 2;
      pic->colorspace = has_alpha ? WEBP_YUV420A : WEBP_YUV420;
    }

    if (!ImgIoUtilCheckSizeArgumentsOverflow(stride, bitstream->height)) {
      status = VP8_STATUS_OUT_OF_MEMORY;
      break;
    }

    ok = WebPPictureAlloc(pic);
    if (!ok) {
      status = VP8_STATUS_OUT_OF_MEMORY;
      break;
    }
    if (pic->use_argb) {
#ifdef WORDS_BIGENDIAN
      output_buffer->colorspace = MODE_ARGB;
#else
      output_buffer->colorspace = MODE_BGRA;
#endif
      output_buffer->u.RGBA.rgba = (uint8_t*)pic->argb;
      output_buffer->u.RGBA.stride = pic->argb_stride * sizeof(uint32_t);
      output_buffer->u.RGBA.size = output_buffer->u.RGBA.stride * pic->height;
    } else {
      output_buffer->colorspace = has_alpha ? MODE_YUVA : MODE_YUV;
      output_buffer->u.YUVA.y = pic->y;
      output_buffer->u.YUVA.u = pic->u;
      output_buffer->u.YUVA.v = pic->v;
      output_buffer->u.YUVA.a = has_alpha ? pic->a : NULL;
      output_buffer->u.YUVA.y_stride = pic->y_stride;
      output_buffer->u.YUVA.u_stride = pic->uv_stride;
      output_buffer->u.YUVA.v_stride = pic->uv_stride;
      output_buffer->u.YUVA.a_stride = has_alpha ? pic->a_stride : 0;
      output_buffer->u.YUVA.y_size = pic->height * pic->y_stride;
      output_buffer->u.YUVA.u_size = (pic->height + 1) / 2 * pic->uv_stride;
      output_buffer->u.YUVA.v_size = (pic->height + 1) / 2 * pic->uv_stride;
      output_buffer->u.YUVA.a_size = pic->height * pic->a_stride;
    }
    output_buffer->is_external_memory = 1;

    status = DecodeWebP(data, data_size, &config);
    ok = (status == VP8_STATUS_OK);
    if (ok && !keep_alpha && pic->use_argb) {
      // Need to wipe out the alpha value, as requested.
      int x, y;
      uint32_t* argb = pic->argb;
      for (y = 0; y < pic->height; ++y) {
        for (x = 0; x < pic->width; ++x) argb[x] |= 0xff000000u;
        argb += pic->argb_stride;
      }
    }
  } while (0);   // <- so we can 'break' out of the loop

  if (status != VP8_STATUS_OK) {
    PrintWebPError("input data", status);
    ok = 0;
  }

  WebPFreeDecBuffer(output_buffer);

  if (ok && metadata != NULL) {
    ok = ExtractMetadata(data, data_size, metadata);
    if (!ok) {
      PrintWebPError("metadata", VP8_STATUS_BITSTREAM_ERROR);
    }
  }
  if (!ok) WebPPictureFree(pic);
  return ok;
}